

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

void mbedtls_ssl_transform_free(mbedtls_ssl_transform *transform)

{
  mbedtls_ssl_transform *transform_local;
  
  if (transform != (mbedtls_ssl_transform *)0x0) {
    mbedtls_cipher_free(&transform->cipher_ctx_enc);
    mbedtls_cipher_free(&transform->cipher_ctx_dec);
    mbedtls_platform_zeroize(transform,0xf0);
  }
  return;
}

Assistant:

void mbedtls_ssl_transform_free(mbedtls_ssl_transform *transform)
{
    if (transform == NULL) {
        return;
    }

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    psa_destroy_key(transform->psa_key_enc);
    psa_destroy_key(transform->psa_key_dec);
#else
    mbedtls_cipher_free(&transform->cipher_ctx_enc);
    mbedtls_cipher_free(&transform->cipher_ctx_dec);
#endif /* MBEDTLS_USE_PSA_CRYPTO */

#if defined(MBEDTLS_SSL_SOME_SUITES_USE_MAC)
#if defined(MBEDTLS_USE_PSA_CRYPTO)
    psa_destroy_key(transform->psa_mac_enc);
    psa_destroy_key(transform->psa_mac_dec);
#else
    mbedtls_md_free(&transform->md_ctx_enc);
    mbedtls_md_free(&transform->md_ctx_dec);
#endif /* MBEDTLS_USE_PSA_CRYPTO */
#endif

    mbedtls_platform_zeroize(transform, sizeof(mbedtls_ssl_transform));
}